

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_type(lysp_yang_ctx *ctx,lysp_type *type)

{
  lysp_type *plVar1;
  long lVar2;
  LY_ERR LVar3;
  lysp_restr *plVar4;
  char *pcVar5;
  ly_ctx *local_148;
  ly_ctx *local_140;
  ly_ctx *local_138;
  ly_ctx *local_130;
  ly_ctx *local_120;
  ly_ctx *local_118;
  ly_ctx *local_110;
  ly_ctx *local_108;
  ly_ctx *local_f8;
  ly_ctx *local_f0;
  ly_ctx *local_e0;
  ly_ctx *local_c8;
  char *local_c0;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  LY_ERR ret___11;
  LY_ERR ret___10;
  char *p__;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  LY_ERR ret__;
  lysp_type *nest_type;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *str_path;
  char *word;
  char *buf;
  lysp_type *plStack_20;
  LY_ERR ret;
  lysp_type *type_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  word_len = 0;
  plStack_20 = type;
  type_local = (lysp_type *)ctx;
  if (type->name != (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_a0 = (ly_ctx *)0x0;
    }
    else {
      local_a0 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_a0,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","type");
    return LY_EVALID;
  }
  LVar3 = get_argument(ctx,Y_PREF_IDENTIF_ARG,(uint16_t *)0x0,&str_path,&word,
                       &stack0xffffffffffffffb8);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (word == (char *)0x0) {
    if (type_local == (lysp_type *)0x0) {
      local_b0 = (ly_ctx *)0x0;
    }
    else {
      local_b0 = *(ly_ctx **)
                  **(undefined8 **)
                    (type_local->bases[1] + (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
    }
    if (sStack_48 == 0) {
      local_c0 = "";
    }
    else {
      local_c0 = str_path;
    }
    buf._4_4_ = lydict_insert(local_b0,local_c0,sStack_48,&plStack_20->name);
  }
  else {
    if (type_local == (lysp_type *)0x0) {
      local_a8 = (ly_ctx *)0x0;
    }
    else {
      local_a8 = *(ly_ctx **)
                  **(undefined8 **)
                    (type_local->bases[1] + (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_a8,str_path,&plStack_20->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    plStack_20->pmod =
         (lysp_module *)
         (((ly_set *)type_local->bases)->field_2).dnodes[((ly_set *)type_local->bases)->count - 1];
    buf._4_4_ = get_keyword((lysp_yang_ctx *)type_local,(ly_stmt *)((long)&nest_type + 4),&str_path,
                            &stack0xffffffffffffffb8);
    if (buf._4_4_ == LY_SUCCESS) {
      if (nest_type._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar3 = buf._4_4_;
      }
      else {
        if (nest_type._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (type_local == (lysp_type *)0x0) {
            local_c8 = (ly_ctx *)0x0;
          }
          else {
            local_c8 = *(ly_ctx **)
                        **(undefined8 **)
                          (type_local->bases[1] +
                          (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
          }
          pcVar5 = lyplg_ext_stmt2str(nest_type._4_4_);
          ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
          return LY_EVALID;
        }
        LVar3 = get_keyword((lysp_yang_ctx *)type_local,(ly_stmt *)((long)&nest_type + 4),&str_path,
                            &stack0xffffffffffffffb8);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        ret___2._3_1_ = nest_type._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar3 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar3, !(bool)ret___2._3_1_) {
        if (nest_type._4_4_ == LY_STMT_BASE) {
          LVar3 = parse_text_fields((lysp_yang_ctx *)type_local,LY_STMT_BASE,&plStack_20->bases,
                                    Y_PREF_IDENTIF_ARG,&plStack_20->exts);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 1;
        }
        else if (nest_type._4_4_ == LY_STMT_BIT) {
          LVar3 = parse_type_enum((lysp_yang_ctx *)type_local,LY_STMT_BIT,&plStack_20->bits);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 2;
        }
        else if (nest_type._4_4_ == LY_STMT_ENUM) {
          LVar3 = parse_type_enum((lysp_yang_ctx *)type_local,LY_STMT_ENUM,&plStack_20->enums);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 4;
        }
        else if (nest_type._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
          LVar3 = parse_ext((lysp_yang_ctx *)type_local,str_path,sStack_48,plStack_20,LY_STMT_TYPE,0
                            ,&plStack_20->exts);
joined_r0x001c05d0:
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        else if (nest_type._4_4_ == LY_STMT_FRACTION_DIGITS) {
          LVar3 = parse_type_fracdigits((lysp_yang_ctx *)type_local,plStack_20);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 8;
        }
        else if (nest_type._4_4_ == LY_STMT_LENGTH) {
          if (plStack_20->length != (lysp_restr *)0x0) {
            if (type_local == (lysp_type *)0x0) {
              local_e0 = (ly_ctx *)0x0;
            }
            else {
              local_e0 = *(ly_ctx **)
                          **(undefined8 **)
                            (type_local->bases[1] +
                            (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
            }
            pcVar5 = lyplg_ext_stmt2str(LY_STMT_LENGTH);
            ly_vlog(local_e0,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar5);
            return LY_EVALID;
          }
          plVar4 = (lysp_restr *)calloc(1,0x40);
          plStack_20->length = plVar4;
          if (plStack_20->length == (lysp_restr *)0x0) {
            if (type_local == (lysp_type *)0x0) {
              local_f0 = (ly_ctx *)0x0;
            }
            else {
              local_f0 = *(ly_ctx **)
                          **(undefined8 **)
                            (type_local->bases[1] +
                            (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
            }
            ly_log(local_f0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type");
            return LY_EMEM;
          }
          LVar3 = parse_restr((lysp_yang_ctx *)type_local,nest_type._4_4_,plStack_20->length);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 0x10;
        }
        else if (nest_type._4_4_ == LY_STMT_PATH) {
          if (plStack_20->path != (lyxp_expr *)0x0) {
            if (type_local == (lysp_type *)0x0) {
              local_f8 = (ly_ctx *)0x0;
            }
            else {
              local_f8 = *(ly_ctx **)
                          **(undefined8 **)
                            (type_local->bases[1] +
                            (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
            }
            pcVar5 = lyplg_ext_stmt2str(LY_STMT_PATH);
            ly_vlog(local_f8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar5);
            return LY_EVALID;
          }
          buf._4_4_ = parse_text_field((lysp_yang_ctx *)type_local,plStack_20,LY_STMT_PATH,0,
                                       (char **)&word_len,Y_STR_ARG,(uint16_t *)0x0,
                                       &plStack_20->exts);
          if (buf._4_4_ != LY_SUCCESS) {
            if (type_local == (lysp_type *)0x0) {
              local_108 = (ly_ctx *)0x0;
            }
            else {
              local_108 = *(ly_ctx **)
                           **(undefined8 **)
                             (type_local->bases[1] +
                             (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
            }
            lydict_remove(local_108,(char *)word_len);
            return buf._4_4_;
          }
          if (type_local == (lysp_type *)0x0) {
            local_110 = (ly_ctx *)0x0;
          }
          else {
            local_110 = *(ly_ctx **)
                         **(undefined8 **)
                           (type_local->bases[1] +
                           (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
          }
          buf._4_4_ = ly_path_parse(local_110,(lysc_node *)0x0,(char *)word_len,0,'\x01',2,0x10,
                                    0x400,&plStack_20->path);
          if (type_local == (lysp_type *)0x0) {
            local_118 = (ly_ctx *)0x0;
          }
          else {
            local_118 = *(ly_ctx **)
                         **(undefined8 **)
                           (type_local->bases[1] +
                           (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
          }
          lydict_remove(local_118,(char *)word_len);
          if (buf._4_4_ != LY_SUCCESS) {
            return buf._4_4_;
          }
          plStack_20->flags = plStack_20->flags | 0x20;
        }
        else if (nest_type._4_4_ == LY_STMT_PATTERN) {
          LVar3 = parse_type_pattern((lysp_yang_ctx *)type_local,&plStack_20->patterns);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 0x40;
        }
        else if (nest_type._4_4_ == LY_STMT_RANGE) {
          if (plStack_20->range != (lysp_restr *)0x0) {
            if (type_local == (lysp_type *)0x0) {
              local_120 = (ly_ctx *)0x0;
            }
            else {
              local_120 = *(ly_ctx **)
                           **(undefined8 **)
                             (type_local->bases[1] +
                             (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
            }
            pcVar5 = lyplg_ext_stmt2str(LY_STMT_RANGE);
            ly_vlog(local_120,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar5);
            return LY_EVALID;
          }
          plVar4 = (lysp_restr *)calloc(1,0x40);
          plStack_20->range = plVar4;
          if (plStack_20->range == (lysp_restr *)0x0) {
            if (type_local == (lysp_type *)0x0) {
              local_130 = (ly_ctx *)0x0;
            }
            else {
              local_130 = *(ly_ctx **)
                           **(undefined8 **)
                             (type_local->bases[1] +
                             (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
            }
            ly_log(local_130,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type");
            return LY_EMEM;
          }
          LVar3 = parse_restr((lysp_yang_ctx *)type_local,nest_type._4_4_,plStack_20->range);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 0x80;
        }
        else {
          if (nest_type._4_4_ == LY_STMT_REQUIRE_INSTANCE) {
            LVar3 = parse_type_reqinstance((lysp_yang_ctx *)type_local,plStack_20);
            goto joined_r0x001c05d0;
          }
          if (nest_type._4_4_ != LY_STMT_TYPE) {
            if (type_local == (lysp_type *)0x0) {
              local_148 = (ly_ctx *)0x0;
            }
            else {
              local_148 = *(ly_ctx **)
                           **(undefined8 **)
                             (type_local->bases[1] +
                             (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
            }
            pcVar5 = lyplg_ext_stmt2str(nest_type._4_4_);
            ly_vlog(local_148,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,"type");
            return LY_EVALID;
          }
          if (plStack_20->types == (lysp_type *)0x0) {
            _ret___11 = (undefined8 *)malloc(0x70);
            if (_ret___11 == (undefined8 *)0x0) {
              if (type_local == (lysp_type *)0x0) {
                local_140 = (ly_ctx *)0x0;
              }
              else {
                local_140 = *(ly_ctx **)
                             **(undefined8 **)
                               (type_local->bases[1] +
                               (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
              }
              ly_log(local_140,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type");
              return LY_EMEM;
            }
            *_ret___11 = 1;
          }
          else {
            *(long *)&plStack_20->types[-1].fraction_digits =
                 *(long *)&plStack_20->types[-1].fraction_digits + 1;
            _ret___11 = (undefined8 *)
                        realloc(&plStack_20->types[-1].fraction_digits,
                                *(long *)&plStack_20->types[-1].fraction_digits * 0x68 + 8);
            if (_ret___11 == (undefined8 *)0x0) {
              *(long *)&plStack_20->types[-1].fraction_digits =
                   *(long *)&plStack_20->types[-1].fraction_digits + -1;
              if (type_local == (lysp_type *)0x0) {
                local_138 = (ly_ctx *)0x0;
              }
              else {
                local_138 = *(ly_ctx **)
                             **(undefined8 **)
                               (type_local->bases[1] +
                               (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
              }
              ly_log(local_138,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type");
              return LY_EMEM;
            }
          }
          plStack_20->types = (lysp_type *)(_ret___11 + 1);
          plVar1 = plStack_20->types;
          lVar2 = *(long *)&plStack_20->types[-1].fraction_digits;
          memset(plVar1 + lVar2 + -1,0,0x68);
          LVar3 = parse_type((lysp_yang_ctx *)type_local,plVar1 + lVar2 + -1);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          plStack_20->flags = plStack_20->flags | 0x100;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)type_local,(ly_stmt *)((long)&nest_type + 4),
                                &str_path,&stack0xffffffffffffffb8);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar3 = LY_SUCCESS;
        if (nest_type._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((plStack_20->exts != (lysp_ext_instance *)0x0) &&
             (LVar3 = ly_set_add((ly_set *)&type_local->types->bits,plStack_20->exts,'\x01',
                                 (uint32_t *)0x0), LVar3 != LY_SUCCESS)) {
            return LVar3;
          }
          buf._4_4_ = LVar3;
          ret___2._3_1_ = true;
          LVar3 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_type(struct lysp_yang_ctx *ctx, struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    const char *str_path = NULL;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_type *nest_type;

    if (type->name) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "type");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_PREF_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, type->name, word, word_len, ret, cleanup);

    /* set module */
    type->pmod = PARSER_CUR_PMOD(ctx);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_BASE:
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &type->bases, Y_PREF_IDENTIF_ARG, &type->exts));
            type->flags |= LYS_SET_BASE;
            break;
        case LY_STMT_BIT:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->bits));
            type->flags |= LYS_SET_BIT;
            break;
        case LY_STMT_ENUM:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->enums));
            type->flags |= LYS_SET_ENUM;
            break;
        case LY_STMT_FRACTION_DIGITS:
            LY_CHECK_RET(parse_type_fracdigits(ctx, type));
            type->flags |= LYS_SET_FRDIGITS;
            break;
        case LY_STMT_LENGTH:
            if (type->length) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->length = calloc(1, sizeof *type->length);
            LY_CHECK_ERR_RET(!type->length, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->length));
            type->flags |= LYS_SET_LENGTH;
            break;
        case LY_STMT_PATH:
            if (type->path) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(LY_STMT_PATH));
                return LY_EVALID;
            }

            /* Usually, in the parser_yang.c, the result of the parsing is stored directly in the
             * corresponding structure, so in case of failure, the lysp_module_free function will take
             * care of removing the parsed value from the dictionary. But in this case, it is not possible
             * to rely on lysp_module_free because the result of the parsing is stored in a local variable.
             */
            LY_CHECK_ERR_RET(ret = parse_text_field(ctx, type, LY_STMT_PATH, 0, &str_path, Y_STR_ARG, NULL, &type->exts),
                    lydict_remove(PARSER_CTX(ctx), str_path), ret);
            ret = ly_path_parse(PARSER_CTX(ctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                    LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, &type->path);
            /* Moreover, even if successful, the string is removed from the dictionary. */
            lydict_remove(PARSER_CTX(ctx), str_path);
            LY_CHECK_RET(ret);
            type->flags |= LYS_SET_PATH;
            break;
        case LY_STMT_PATTERN:
            LY_CHECK_RET(parse_type_pattern(ctx, &type->patterns));
            type->flags |= LYS_SET_PATTERN;
            break;
        case LY_STMT_RANGE:
            if (type->range) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->range = calloc(1, sizeof *type->range);
            LY_CHECK_ERR_RET(!type->range, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->range));
            type->flags |= LYS_SET_RANGE;
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            LY_CHECK_RET(parse_type_reqinstance(ctx, type));
            /* LYS_SET_REQINST checked and set inside parse_type_reqinstance() */
            break;
        case LY_STMT_TYPE:
            LY_ARRAY_NEW_RET(PARSER_CTX(ctx), type->types, nest_type, LY_EMEM);
            LY_CHECK_RET(parse_type(ctx, nest_type));
            type->flags |= LYS_SET_TYPE;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, type, LY_STMT_TYPE, 0, &type->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "type");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, type->exts, ret, cleanup);
    }

cleanup:
    return ret;
}